

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

int jx9Vfs_getenv(jx9_context *pCtx,int nArg,jx9_value **apArg)

{
  jx9_context *pCtx_00;
  int iVar1;
  char *pcVar2;
  int local_3c;
  void *pvStack_38;
  int iLen;
  jx9_vfs *pVfs;
  char *zEnv;
  jx9_value **apArg_local;
  jx9_context *pjStack_18;
  int nArg_local;
  jx9_context *pCtx_local;
  
  zEnv = (char *)apArg;
  apArg_local._4_4_ = nArg;
  pjStack_18 = pCtx;
  if ((nArg < 1) || (iVar1 = jx9_value_is_string(*apArg), iVar1 == 0)) {
    jx9_result_bool(pjStack_18,0);
  }
  else {
    pvStack_38 = jx9_context_user_data(pjStack_18);
    pCtx_00 = pjStack_18;
    if ((pvStack_38 == (void *)0x0) || (*(long *)((long)pvStack_38 + 0xf0) == 0)) {
      pcVar2 = jx9_function_name(pjStack_18);
      jx9_context_throw_error_format
                (pCtx_00,2,
                 "IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE",
                 pcVar2);
      jx9_result_bool(pjStack_18,0);
    }
    else {
      pVfs = (jx9_vfs *)jx9_value_to_string(*(jx9_value **)zEnv,&local_3c);
      jx9_result_bool(pjStack_18,0);
      if (0 < local_3c) {
        (**(code **)((long)pvStack_38 + 0xf0))(pVfs,pjStack_18);
      }
    }
  }
  return 0;
}

Assistant:

static int jx9Vfs_getenv(jx9_context *pCtx, int nArg, jx9_value **apArg)
{
	const char *zEnv;
	jx9_vfs *pVfs;
	int iLen;
	if( nArg < 1 || !jx9_value_is_string(apArg[0]) ){
		/* Missing/Invalid argument, return FALSE */
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Point to the underlying vfs */
	pVfs = (jx9_vfs *)jx9_context_user_data(pCtx);
	if( pVfs == 0 || pVfs->xGetenv == 0 ){
		/* IO routine not implemented, return NULL */
		jx9_context_throw_error_format(pCtx, JX9_CTX_WARNING, 
			"IO routine(%s) not implemented in the underlying VFS, JX9 is returning FALSE", 
			jx9_function_name(pCtx)
			);
		jx9_result_bool(pCtx, 0);
		return JX9_OK;
	}
	/* Extract the environment variable */
	zEnv = jx9_value_to_string(apArg[0], &iLen);
	/* Set a boolean FALSE as the default return value */
	jx9_result_bool(pCtx, 0);
	if( iLen < 1 ){
		/* Empty string */
		return JX9_OK;
	}
	/* Perform the requested operation */
	pVfs->xGetenv(zEnv, pCtx);
	return JX9_OK;
}